

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManDemiterDual(Gia_Man_t *p,Gia_Man_t **pp0,Gia_Man_t **pp1)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Gia_Man_t **ppGVar11;
  uint uVar12;
  uint fOdd;
  long lVar13;
  bool bVar14;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x11e8,"int Gia_ManDemiterDual(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  if ((p->vCos->nSize & 1) != 0) {
    __assert_fail("Gia_ManCoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x11e9,"int Gia_ManDemiterDual(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  *pp1 = (Gia_Man_t *)0x0;
  *pp0 = (Gia_Man_t *)0x0;
  fOdd = 0;
  do {
    __ptr = Gia_ManCollectReach(p,fOdd);
    p_00 = Gia_ManStart(p->vCos->nSize / 2 + p->vCis->nSize + __ptr->nSize + 1);
    pcVar2 = p->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    p_00->pName = pcVar7;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    p_00->pSpec = pcVar7;
    p->pObjs->Value = 0;
    pVVar8 = p->vCis;
    uVar10 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar13 = 0;
      do {
        if ((int)uVar10 <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar8->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f5dd8;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_001f5df7:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_001f5df7;
        pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
        lVar13 = lVar13 + 1;
        pVVar8 = p->vCis;
        uVar10 = (ulong)pVVar8->nSize;
      } while (lVar13 < (long)(uVar10 - (long)p->nRegs));
    }
    if (0 < __ptr->nSize) {
      lVar13 = 0;
      do {
        iVar1 = __ptr->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f5dd8;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        uVar10 = *(ulong *)pGVar3;
        if (((int)pGVar3[-(ulong)((uint)uVar10 & 0x1fffffff)].Value < 0) ||
           (uVar5 = (uint)(uVar10 >> 0x20), (int)pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value < 0))
        goto LAB_001f5e16;
        uVar5 = Gia_ManAppendAnd(p_00,(uint)(uVar10 >> 0x1d) & 1 ^
                                      pGVar3[-(ulong)((uint)uVar10 & 0x1fffffff)].Value,
                                 pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
        pGVar3->Value = uVar5;
        lVar13 = lVar13 + 1;
      } while (lVar13 < __ptr->nSize);
    }
    pVVar8 = p->vCos;
    if (0 < pVVar8->nSize) {
      lVar13 = 0;
      do {
        iVar1 = pVVar8->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001f5dd8:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (((uint)lVar13 & 1) == fOdd) {
          pGVar3 = p->pObjs + iVar1;
          uVar12 = (uint)*(undefined8 *)pGVar3;
          uVar5 = pGVar3[-(ulong)(uVar12 & 0x1fffffff)].Value;
          if ((int)uVar5 < 0) {
LAB_001f5e16:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(p_00,uVar12 >> 0x1d & 1 ^ uVar5);
        }
        lVar13 = lVar13 + 1;
        pVVar8 = p->vCos;
      } while (lVar13 < pVVar8->nSize);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    bVar14 = fOdd == 0;
    ppGVar11 = pp1;
    if (bVar14) {
      ppGVar11 = pp0;
    }
    *ppGVar11 = p_00;
    fOdd = fOdd + 1;
    if (!bVar14) {
      return 1;
    }
  } while( true );
}

Assistant:

int Gia_ManDemiterDual( Gia_Man_t * p, Gia_Man_t ** pp0, Gia_Man_t ** pp1 )
{
    Gia_Obj_t * pObj;
    int i, fOdd;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) % 2 == 0 );
    *pp0 = *pp1 = NULL;
    for ( fOdd = 0; fOdd < 2; fOdd++ )
    {
        Vec_Int_t * vNodes = Gia_ManCollectReach( p, fOdd );
        Gia_Man_t * pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Gia_ManCoNum(p)/2 );
        pNew->pName = Abc_UtilStrsav( p->pName );
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
        Gia_ManConst0(p)->Value = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachObjVec( vNodes, p, pObj, i )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            if ( (i & 1) == fOdd )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Vec_IntFree( vNodes );
        if ( fOdd )
            *pp1 = pNew;
        else
            *pp0 = pNew;
    }
    return 1;
}